

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakeHostSystemInformationCommand::GetValue
          (cmCMakeHostSystemInformationCommand *this,SystemInformation *info,string *key,
          string *value)

{
  bool bVar1;
  uint uVar2;
  char *value_00;
  size_t value_01;
  char *pcVar3;
  string *this_00;
  string e;
  string local_60;
  string local_40;
  
  pcVar3 = "NUMBER_OF_LOGICAL_CORES";
  bVar1 = std::operator==(key,"NUMBER_OF_LOGICAL_CORES");
  if (bVar1) {
    uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU(info);
LAB_00372f4b:
    value_01 = (size_t)uVar2;
LAB_00372f55:
    ValueToString_abi_cxx11_(&local_60,(cmCMakeHostSystemInformationCommand *)pcVar3,value_01);
  }
  else {
    pcVar3 = "NUMBER_OF_PHYSICAL_CORES";
    bVar1 = std::operator==(key,"NUMBER_OF_PHYSICAL_CORES");
    if (bVar1) {
      uVar2 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(info);
      goto LAB_00372f4b;
    }
    pcVar3 = "HOSTNAME";
    bVar1 = std::operator==(key,"HOSTNAME");
    if (!bVar1) {
      bVar1 = std::operator==(key,"FQDN");
      if (bVar1) {
        cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_(&local_40,info);
        std::__cxx11::string::string((string *)&local_60,(string *)&local_40);
        std::__cxx11::string::operator=((string *)value,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        this_00 = &local_40;
        goto LAB_00372f68;
      }
      pcVar3 = "TOTAL_VIRTUAL_MEMORY";
      bVar1 = std::operator==(key,"TOTAL_VIRTUAL_MEMORY");
      if (bVar1) {
        value_01 = cmsys::SystemInformation::GetTotalVirtualMemory(info);
      }
      else {
        pcVar3 = "AVAILABLE_VIRTUAL_MEMORY";
        bVar1 = std::operator==(key,"AVAILABLE_VIRTUAL_MEMORY");
        if (bVar1) {
          value_01 = cmsys::SystemInformation::GetAvailableVirtualMemory(info);
        }
        else {
          pcVar3 = "TOTAL_PHYSICAL_MEMORY";
          bVar1 = std::operator==(key,"TOTAL_PHYSICAL_MEMORY");
          if (bVar1) {
            value_01 = cmsys::SystemInformation::GetTotalPhysicalMemory(info);
          }
          else {
            pcVar3 = "AVAILABLE_PHYSICAL_MEMORY";
            bVar1 = std::operator==(key,"AVAILABLE_PHYSICAL_MEMORY");
            if (!bVar1) {
              std::operator+(&local_60,"does not recognize <key> ",key);
              cmCommand::SetError(&this->super_cmCommand,&local_60);
              std::__cxx11::string::~string((string *)&local_60);
              return false;
            }
            value_01 = cmsys::SystemInformation::GetAvailablePhysicalMemory(info);
          }
        }
      }
      goto LAB_00372f55;
    }
    value_00 = cmsys::SystemInformation::GetHostname(info);
    ValueToString_abi_cxx11_(&local_60,(cmCMakeHostSystemInformationCommand *)pcVar3,value_00);
  }
  this_00 = &local_60;
  std::__cxx11::string::operator=((string *)value,(string *)this_00);
LAB_00372f68:
  std::__cxx11::string::~string((string *)this_00);
  return true;
}

Assistant:

bool cmCMakeHostSystemInformationCommand
::GetValue(cmsys::SystemInformation &info,
           std::string const& key, std::string &value)
{
  if(key == "NUMBER_OF_LOGICAL_CORES")
    {
    value = this->ValueToString(info.GetNumberOfLogicalCPU());
    }
  else if(key == "NUMBER_OF_PHYSICAL_CORES")
    {
    value = this->ValueToString(info.GetNumberOfPhysicalCPU());
    }
  else if(key == "HOSTNAME")
    {
    value = this->ValueToString(info.GetHostname());
    }
  else if(key == "FQDN")
    {
    value = this->ValueToString(info.GetFullyQualifiedDomainName());
    }
  else if(key == "TOTAL_VIRTUAL_MEMORY")
    {
    value = this->ValueToString(info.GetTotalVirtualMemory());
    }
  else if(key == "AVAILABLE_VIRTUAL_MEMORY")
    {
    value = this->ValueToString(info.GetAvailableVirtualMemory());
    }
  else if(key == "TOTAL_PHYSICAL_MEMORY")
    {
    value = this->ValueToString(info.GetTotalPhysicalMemory());
    }
  else if(key == "AVAILABLE_PHYSICAL_MEMORY")
    {
    value = this->ValueToString(info.GetAvailablePhysicalMemory());
    }
  else
    {
    std::string e = "does not recognize <key> " + key;
    this->SetError(e);
    return false;
    }

  return true;
}